

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O0

Wrench * iDynTree::computeKnownTermsOfEstimationEquationWithInternalFT
                   (Model *model,Traversal *subModelTraversal,SensorsList *sensors,
                   JointPosDoubleArray *jointPos,LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
                   SensorsMeasurements *ftSensorsMeasurements,estimateExternalWrenchesBuffers *bufs)

{
  SpatialMomentum *pSVar1;
  long lVar2;
  uint uVar3;
  Wrench *pWVar4;
  ulong uVar5;
  Transform *pTVar6;
  long in_RDX;
  long in_RSI;
  Wrench *in_RDI;
  undefined8 in_R8;
  LinkVelArray *in_R9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  LinkAccArray *in_stack_00000008;
  long in_stack_00000018;
  Transform visitedLink_X_child;
  IJointConstPtr neighborJoint;
  LinkIndex childIndex;
  LinkIndex neighborIndex;
  uint neigh_i;
  Twist *v;
  SpatialAcc *properAcc;
  SpatialInertia *I;
  LinkConstPtr parentLink;
  LinkIndex visitedLinkIndex;
  LinkConstPtr visitedLink;
  int traversalEl;
  SpatialForceVector local_310 [56];
  Transform local_2d8 [56];
  Wrench local_2a0;
  Transform local_268 [96];
  undefined1 local_208 [16];
  long *local_1f8;
  SensorsList *local_1f0;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  SensorsList *in_stack_fffffffffffffe28;
  uint local_1cc;
  SpatialInertia local_180 [56];
  Twist local_148 [56];
  Wrench local_110;
  Wrench local_d8;
  Wrench local_a0;
  SpatialMomentum *local_68;
  undefined8 local_60;
  Twist *local_58;
  long local_50;
  long local_48;
  undefined8 local_40;
  int local_34;
  LinkVelArray *local_30;
  undefined8 local_28;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_34 = iDynTree::Traversal::getNrOfVisitedLinks();
  auVar7._8_8_ = in_stack_fffffffffffffe20;
  auVar7._0_8_ = in_stack_fffffffffffffe18;
  do {
    local_34 = local_34 + -1;
    if (local_34 < 0) {
      SpatialVector<iDynTree::SpatialForceVector>::Zero();
      iDynTree::Wrench::Wrench(in_RDI,local_310);
      iDynTree::SpatialForceVector::~SpatialForceVector(local_310);
      return in_RDI;
    }
    local_40 = iDynTree::Traversal::getLink(local_18);
    local_48 = iDynTree::Link::getIndex();
    local_50 = iDynTree::Traversal::getParentLink(local_18);
    local_58 = (Twist *)iDynTree::Link::getInertia();
    local_60 = iDynTree::LinkAccArray::operator()(in_stack_00000008,local_48);
    local_68 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(local_30,local_48);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)&local_110,(SpatialAcc *)local_58);
    pSVar1 = local_68;
    iDynTree::SpatialInertia::operator*(local_180,local_58);
    iDynTree::Twist::operator*(local_148,pSVar1);
    iDynTree::Wrench::operator+(&local_d8,&local_110);
    getMeasuredWrench(in_stack_fffffffffffffe28,auVar7._8_8_,auVar7._0_8_);
    iDynTree::Wrench::operator-(&local_a0,&local_d8);
    pWVar4 = (Wrench *)
             iDynTree::LinkWrenches::operator()((LinkWrenches *)(in_stack_00000018 + 0x48),local_48)
    ;
    iDynTree::Wrench::operator=(pWVar4,&local_a0);
    Wrench::~Wrench((Wrench *)0x545af2);
    Wrench::~Wrench((Wrench *)0x545aff);
    Wrench::~Wrench((Wrench *)0x545b0c);
    Wrench::~Wrench((Wrench *)0x545b19);
    SpatialMomentum::~SpatialMomentum((SpatialMomentum *)0x545b26);
    Wrench::~Wrench((Wrench *)0x545b33);
    local_1cc = 0;
    while( true ) {
      uVar3 = iDynTree::Model::getNrOfNeighbors(local_10);
      if (uVar3 <= local_1cc) break;
      auVar7 = iDynTree::Model::getNeighbor(local_10,(uint)local_48);
      in_stack_fffffffffffffe28 = auVar7._0_8_;
      uVar5 = iDynTree::Traversal::isParentOf(local_18,local_48);
      lVar2 = local_10;
      if ((uVar5 & 1) != 0) {
        local_1f0 = in_stack_fffffffffffffe28;
        auVar8 = iDynTree::Model::getNeighbor(local_10,(uint)local_48);
        local_208 = auVar8;
        local_1f8 = (long *)iDynTree::Model::getJoint(lVar2);
        pTVar6 = (Transform *)
                 (**(code **)(*local_1f8 + 0x50))(local_1f8,local_28,local_48,local_1f0);
        iDynTree::Transform::Transform(local_268,pTVar6);
        pWVar4 = (Wrench *)
                 iDynTree::LinkWrenches::operator()
                           ((LinkWrenches *)(in_stack_00000018 + 0x48),local_48);
        iDynTree::LinkWrenches::operator()
                  ((LinkWrenches *)(in_stack_00000018 + 0x48),(long)local_1f0);
        iDynTree::Transform::operator*(local_2d8,(Wrench *)local_268);
        iDynTree::Wrench::operator+(&local_2a0,pWVar4);
        pWVar4 = (Wrench *)
                 iDynTree::LinkWrenches::operator()
                           ((LinkWrenches *)(in_stack_00000018 + 0x48),local_48);
        iDynTree::Wrench::operator=(pWVar4,&local_2a0);
        Wrench::~Wrench((Wrench *)0x545d12);
        Wrench::~Wrench((Wrench *)0x545d1f);
      }
      local_1cc = local_1cc + 1;
    }
  } while (local_50 != 0);
  pWVar4 = (Wrench *)
           iDynTree::LinkWrenches::operator()((LinkWrenches *)(in_stack_00000018 + 0x48),local_48);
  iDynTree::Wrench::Wrench(in_RDI,pWVar4);
  return in_RDI;
}

Assistant:

Wrench computeKnownTermsOfEstimationEquationWithInternalFT(const Model& model,
                                                           const Traversal& subModelTraversal,
                                                           const SensorsList& sensors,
                                                           const JointPosDoubleArray & jointPos,
                                                           const LinkVelArray& linkVel,
                                                           const LinkAccArray& linkProperAcc,
                                                           const SensorsMeasurements& ftSensorsMeasurements,
                                                                 estimateExternalWrenchesBuffers& bufs)
{
    // First compute the known term of the estimation for each link:
    // this loop is similar to the dynamic phase of the RNEA
    // \todo pimp up performance as done in RNEADynamicPhase
     for(int traversalEl = subModelTraversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
     {
         LinkConstPtr visitedLink = subModelTraversal.getLink(traversalEl);
         LinkIndex    visitedLinkIndex = visitedLink->getIndex();
         LinkConstPtr parentLink  = subModelTraversal.getParentLink(traversalEl);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         bufs.b_contacts_subtree(visitedLinkIndex) = I*properAcc + v*(I*v) - getMeasuredWrench(sensors,ftSensorsMeasurements,visitedLinkIndex);

         // Iterate on childs of visitedLink
         // We obtain all the children as all the neighbors of the link, except
         // for its parent
         // \todo TODO this point is definitly Tree-specific
         // \todo TODO this "get child" for is duplicated in the code, we
         //            should try to consolidate it
         for(unsigned int neigh_i=0; neigh_i < model.getNrOfNeighbors(visitedLinkIndex); neigh_i++)
         {
             LinkIndex neighborIndex = model.getNeighbor(visitedLinkIndex,neigh_i).neighborLink;
             // Check if this neighbor is a child of the link according to this traversal
             if( subModelTraversal.isParentOf(visitedLinkIndex,neighborIndex) )
             {
                 LinkIndex childIndex = neighborIndex;
                 IJointConstPtr neighborJoint = model.getJoint(model.getNeighbor(visitedLinkIndex,neigh_i).neighborJoint);
                 Transform visitedLink_X_child = neighborJoint->getTransform(jointPos,visitedLinkIndex,childIndex);

                 // One term of the sum in Equation 5.20 in Featherstone 2008
                 bufs.b_contacts_subtree(visitedLinkIndex) = bufs.b_contacts_subtree(visitedLinkIndex)
                                                            + visitedLink_X_child*bufs.b_contacts_subtree(childIndex);
             }
         }

         if( parentLink == 0 )
         {
             // If the visited link is the base of the submodel, the
             // computed known terms is the known term of the submodel itself
             return bufs.b_contacts_subtree(visitedLinkIndex);
         }
     }

     // If we reach this point of the code, something is really really wrong
     assert(false);
     return Wrench::Zero();
}